

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.h
# Opt level: O0

void __thiscall
CVmMetaclassHTTPServer::create_for_image_load(CVmMetaclassHTTPServer *this,vm_obj_id_t id)

{
  int in_ESI;
  undefined8 in_RDI;
  CVmObjTable *unaff_retaddr;
  vm_obj_id_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  CVmObject::operator_new(CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  CVmObjHTTPServer::CVmObjHTTPServer((CVmObjHTTPServer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0))
  ;
  CVmObjTable::set_obj_gc_characteristics
            (unaff_retaddr,(vm_obj_id_t)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI);
  CVmObjTable::set_obj_transient
            ((CVmObjTable *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

void create_for_image_load(VMG_ vm_obj_id_t id)
    {
        new (vmg_ id) CVmObjHTTPServer();
        G_obj_table->set_obj_gc_characteristics(id, FALSE, FALSE);
        G_obj_table->set_obj_transient(id);
    }